

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap_sort.c
# Opt level: O0

void down_heap(int from,int to)

{
  int iVar1;
  int local_1c;
  int local_18;
  int j;
  int i;
  int val;
  int to_local;
  int from_local;
  
  iVar1 = arr[from];
  local_18 = from;
  while (local_18 <= to / 2) {
    local_1c = local_18 * 2;
    if ((local_1c + 1 <= to) && (arr[local_1c + 1] < arr[local_1c])) {
      local_1c = local_1c + 1;
    }
    if (iVar1 <= arr[local_1c]) break;
    arr[local_18] = arr[local_1c];
    local_18 = local_1c;
  }
  arr[local_18] = iVar1;
  return;
}

Assistant:

void down_heap(int from, int to) {
  int val = arr[from];

  int i = from;
  while (i <= to / 2) {
    int j = i * 2;
    if (j + 1 <= to && arr[j] > arr[j + 1]) {
      j++;
    }

    if (val <= arr[j]) {
      break;
    }

    arr[i] = arr[j];
    i = j;
  }

  arr[i] = val;
}